

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::assert_not_in(void)

{
  initializer_list<int> __l;
  allocator_type local_49;
  Assert local_48;
  vector<int,_std::allocator<int>_> v;
  
  local_48.m_file = (char *)0x100000000;
  local_48.m_line = 2;
  local_48._12_4_ = 3;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_49);
  local_48.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_48.m_line = 0x12e;
  UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>(&local_48,10,&v);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(assert_not_in)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_NOT_IN(10, v);
        }
        catch (UnitTests::TestFailure&)
        {
            FAIL("ASSERT_NOT_IN should not have fired here.");
        }
    }